

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

void spvtools::opt::anon_unknown_27::GetBlocksInPath
               (uint32_t block,uint32_t entry,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks_in_path,CFG *cfg)

{
  pointer puVar1;
  undefined8 in_RAX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  pointer puVar3;
  __ireturn_type _Var4;
  uint32_t pid;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pvVar2 = CFG::preds(cfg,block);
  puVar1 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    uStack_38 = CONCAT44(*puVar3,(undefined4)uStack_38);
    _Var4 = std::__detail::
            _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)blocks_in_path,(value_type *)((long)&uStack_38 + 4));
    if ((((undefined1  [16])_Var4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (uStack_38._4_4_ != entry)) {
      GetBlocksInPath(uStack_38._4_4_,entry,blocks_in_path,cfg);
    }
  }
  return;
}

Assistant:

void GetBlocksInPath(uint32_t block, uint32_t entry,
                     std::unordered_set<uint32_t>* blocks_in_path,
                     const CFG& cfg) {
  for (uint32_t pid : cfg.preds(block)) {
    if (blocks_in_path->insert(pid).second) {
      if (pid != entry) {
        GetBlocksInPath(pid, entry, blocks_in_path, cfg);
      }
    }
  }
}